

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void putbuffer(void *data,int size)

{
  int iVar1;
  long lVar2;
  long lVar3;
  char *stptr;
  size_t __n;
  
  iVar1 = bank;
  if (size == 0) {
    return;
  }
  lVar3 = (long)bank;
  lVar2 = (long)loccnt;
  if (lVar3 < 0xf0) {
    if (bank * 0x2000 + size + loccnt <= rom_limit) {
      if (pass == 1) {
        __n = (size_t)size;
        if (data == (void *)0x0) {
          memset(rom[lVar3] + lVar2,0,__n);
        }
        else {
          memcpy(rom[lVar3] + lVar2,data,__n);
        }
        memset(map[lVar3] + lVar2,page * 0x20 + section,__n);
      }
      goto LAB_0010fd1d;
    }
    stptr = "ROM overflow!";
  }
  else {
    if (loccnt + size < 0x2000) {
LAB_0010fd1d:
      bank = (size + loccnt >> 0xd) + iVar1;
      loccnt = size + loccnt & 0x1fff;
      if (0xef < bank) {
        return;
      }
      if (bank <= max_bank) {
        return;
      }
      if (loccnt != 0) {
        max_bank = bank;
        return;
      }
      max_bank = bank + -1;
      return;
    }
    stptr = "PROC overflow!";
  }
  warning(stptr);
  stop_pass = 1;
  errcnt = errcnt + 1;
  return;
}

Assistant:

void
putbuffer(void *data, int size)
{
	int addr;

	/* check size */
	if (size == 0)
		return;

	/* check if the buffer will fit in the rom */
	if (bank >= RESERVED_BANK) {
		addr  = loccnt + size;

		if (addr > 0x1FFF) {
			fatal_error("PROC overflow!");
			return;
		}
	}
	else {
		addr  = loccnt + size + (bank << 13);

		if (addr > rom_limit) {
			fatal_error("ROM overflow!");
			return;
		}

		/* copy the buffer */
		if (pass == LAST_PASS) {
			if (data) {
				memcpy(&rom[bank][loccnt], data, size);
				memset(&map[bank][loccnt], section + (page << 5), size);
			}
			else {
				memset(&rom[bank][loccnt], 0, size);
				memset(&map[bank][loccnt], section + (page << 5), size);
			}
		}
	}

	/* update the location counter */
	bank  += (loccnt + size) >> 13;
	loccnt = (loccnt + size) & 0x1FFF;

	/* update rom size */
	if (bank < RESERVED_BANK) {
		if (bank > max_bank) {
			if (loccnt)
				max_bank = bank;
			else
				max_bank = bank - 1;
		}
	}
}